

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_loopfilter.c
# Opt level: O3

void av1_filter_block_plane_horz_opt
               (AV1_COMMON *cm,MACROBLOCKD *xd,MACROBLOCKD_PLANE *plane_ptr,uint32_t mi_row,
               uint32_t mi_col,AV1_DEBLOCKING_PARAMETERS *params_buf,TX_SIZE *tx_buf,
               int num_mis_in_lpf_unit_height_log2)

{
  undefined1 use_filter_type;
  uint8_t *puVar1;
  MB_MODE_INFO *pMVar2;
  MB_MODE_INFO **ppMVar3;
  bool bVar4;
  char cVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  loop_filter_info_n *lfi_n;
  ulong uVar10;
  uint uVar11;
  uint8_t *dst;
  byte bVar12;
  AV1_DEBLOCKING_PARAMETERS *pAVar13;
  int iVar14;
  long lVar15;
  byte bVar16;
  int iVar17;
  uint uVar18;
  byte *pbVar20;
  uint uVar21;
  char cVar22;
  int iVar23;
  MB_MODE_INFO *pMVar24;
  ulong uVar19;
  
  iVar14 = ((plane_ptr->dst).height + 3 >> 2) - mi_row;
  iVar17 = 1 << ((byte)num_mis_in_lpf_unit_height_log2 & 0x1f);
  if (iVar14 < iVar17) {
    iVar17 = iVar14;
  }
  iVar8 = ((plane_ptr->dst).width + 3 >> 2) - mi_col;
  iVar14 = 0x20;
  if (iVar8 < 0x20) {
    iVar14 = iVar8;
  }
  if (0 < iVar8) {
    puVar1 = (plane_ptr->dst).buf;
    iVar8 = (plane_ptr->dst).stride;
    lVar15 = (long)(cm->mi_params).mi_stride;
    lfi_n = &cm->lf_info;
    uVar11 = 0;
    do {
      uVar18 = uVar11 + mi_col;
      uVar19 = (ulong)uVar18;
      params_buf->filter_length = '\0';
      ppMVar3 = (cm->mi_params).mi_grid_base + (cm->mi_params).mi_stride * mi_row + uVar19;
      pMVar2 = *ppMVar3;
      cVar22 = (char)*(ushort *)&pMVar2->field_0xa7;
      if ((xd == (MACROBLOCKD *)0x0) || (xd->lossless[*(ushort *)&pMVar2->field_0xa7 & 7] == 0)) {
        bVar16 = pMVar2->tx_size;
        if (((cVar22 < '\0') || ('\0' < pMVar2->ref_frame[0])) && (pMVar2->skip_txfm == '\0')) {
          uVar10 = (ulong)pMVar2->bsize;
          bVar16 = pMVar2->inter_tx_size
                   [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                           [uVar10] - 1 & uVar18) >>
                    (av1_get_txb_size_index_tw_w_log2_table[uVar10] & 0x1f)) +
                    (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                            [uVar10] - 1 & mi_row) >>
                     (*(byte *)((long)&av1_get_txb_size_index_tw_h_log2_table + uVar10) & 0x1f)) <<
                    (av1_get_txb_size_index_stride_log2_table[uVar10] & 0x1f))];
        }
        if (mi_row != 0) {
          pMVar24 = ppMVar3[-lVar15];
          if (xd != (MACROBLOCKD *)0x0) goto LAB_00393c05;
          cVar5 = (char)*(undefined2 *)&pMVar24->field_0xa7;
LAB_00393c46:
          bVar7 = pMVar24->tx_size;
          if (((cVar5 < '\0') || ('\0' < pMVar24->ref_frame[0])) && (pMVar24->skip_txfm == '\0')) {
            uVar10 = (ulong)pMVar24->bsize;
            bVar7 = pMVar24->inter_tx_size
                    [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                            [uVar10] - 1 & uVar18) >>
                     (av1_get_txb_size_index_tw_w_log2_table[uVar10] & 0x1f)) +
                     (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                             [uVar10] - 1 & mi_row - 1) >>
                      (*(byte *)((long)&av1_get_txb_size_index_tw_h_log2_table + uVar10) & 0x1f)) <<
                     (av1_get_txb_size_index_stride_log2_table[uVar10] & 0x1f))];
          }
          goto LAB_00393cc6;
        }
        bVar12 = 0x80;
      }
      else if (mi_row == 0) {
        bVar12 = 0x80;
        bVar16 = 0;
      }
      else {
        pMVar24 = ppMVar3[-lVar15];
        bVar16 = 0;
LAB_00393c05:
        cVar5 = (char)*(ushort *)&pMVar24->field_0xa7;
        if (xd->lossless[*(ushort *)&pMVar24->field_0xa7 & 7] == 0) goto LAB_00393c46;
        bVar7 = 0;
LAB_00393cc6:
        bVar12 = block_size_wide[pMVar24->bsize];
        bVar6 = get_filter_level(cm,lfi_n,1,0,pMVar2);
        if (bVar6 == 0) {
          bVar6 = get_filter_level(cm,lfi_n,1,0,pMVar24);
        }
        if (pMVar24 == pMVar2) {
          if (pMVar2->skip_txfm == '\0') {
            bVar4 = true;
          }
          else {
            if (cVar22 < '\0') goto LAB_00393d84;
            bVar4 = pMVar2->ref_frame[0] < '\x01';
          }
          if (!bVar4) goto LAB_00393d84;
        }
        if (bVar6 != 0) {
          params_buf->filter_length = (uint8_t)horz_filter_length_luma[bVar16][bVar7];
          params_buf->lfthr = (loop_filter_thresh *)(lfi_n->lfthr[0].mblim + (uint)bVar6 * 0x30);
        }
      }
LAB_00393d84:
      bVar7 = block_size_wide[pMVar2->bsize];
      if (bVar12 < block_size_wide[pMVar2->bsize]) {
        bVar7 = bVar12;
      }
      *tx_buf = bVar16;
      iVar23 = tx_size_high_unit[bVar16];
      uVar21 = mi_row + iVar23;
      if (uVar21 < iVar17 + mi_row) {
        pbVar20 = tx_buf + iVar23;
        pAVar13 = params_buf + iVar23;
        do {
          pAVar13->filter_length = '\0';
          uVar9 = (cm->mi_params).mi_stride * uVar21;
          ppMVar3 = (cm->mi_params).mi_grid_base;
          pMVar2 = ppMVar3[uVar9 + uVar19];
          cVar22 = (char)*(ushort *)&pMVar2->field_0xa7;
          if ((xd == (MACROBLOCKD *)0x0) || (xd->lossless[*(ushort *)&pMVar2->field_0xa7 & 7] == 0))
          {
            bVar12 = pMVar2->tx_size;
            if (((cVar22 < '\0') || ('\0' < pMVar2->ref_frame[0])) && (pMVar2->skip_txfm == '\0')) {
              uVar10 = (ulong)pMVar2->bsize;
              bVar12 = pMVar2->inter_tx_size
                       [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                               [uVar10] - 1 & uVar18) >>
                        (av1_get_txb_size_index_tw_w_log2_table[uVar10] & 0x1f)) +
                        (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                [uVar10] - 1 & uVar21) >>
                         (*(byte *)((long)&av1_get_txb_size_index_tw_h_log2_table + uVar10) & 0x1f))
                        << (av1_get_txb_size_index_stride_log2_table[uVar10] & 0x1f))];
            }
          }
          else {
            bVar12 = 0;
          }
          pMVar24 = ppMVar3[(ulong)uVar9 + (uVar19 - lVar15)];
          bVar6 = get_filter_level(cm,lfi_n,1,0,pMVar2);
          if (bVar6 == 0) {
            bVar6 = get_filter_level(cm,lfi_n,1,0,pMVar24);
          }
          if (pMVar24 == pMVar2) {
            if (pMVar2->skip_txfm == '\0') {
              bVar4 = true;
LAB_00393f1f:
              if (bVar4) goto joined_r0x00393f25;
            }
            else if (-1 < cVar22) {
              bVar4 = pMVar2->ref_frame[0] < '\x01';
              goto LAB_00393f1f;
            }
          }
          else {
joined_r0x00393f25:
            if (bVar6 != 0) {
              pAVar13->filter_length = (uint8_t)horz_filter_length_luma[bVar12][bVar16];
              pAVar13->lfthr = (loop_filter_thresh *)(lfi_n->lfthr[0].mblim + (uint)bVar6 * 0x30);
            }
          }
          if (block_size_wide[pMVar2->bsize] <= bVar7) {
            bVar7 = block_size_wide[pMVar2->bsize];
          }
          *pbVar20 = bVar12;
          iVar23 = tx_size_high_unit[bVar12];
          uVar21 = uVar21 + iVar23;
          pbVar20 = pbVar20 + iVar23;
          pAVar13 = pAVar13 + iVar23;
          bVar16 = bVar12;
        } while (uVar21 < iVar17 + mi_row);
      }
      if (((((uVar11 & 3) != 0) || (uVar18 = uVar11 | 3, iVar14 <= (int)uVar18)) || (bVar7 < 0x10))
         && (uVar18 = uVar11 + 1, bVar7 < 8 || iVar14 <= (int)(uVar11 + 1))) {
        uVar18 = uVar11;
      }
      if (0 < iVar17) {
        dst = puVar1 + (int)(uVar11 << 2);
        iVar23 = 0;
        pbVar20 = tx_buf;
        pAVar13 = params_buf;
        do {
          if (*pbVar20 == 0xff) {
            pAVar13->filter_length = '\0';
            *pbVar20 = 0;
          }
          use_filter_type = cm->seq_params->use_highbitdepth;
          filter_horz(dst,iVar8,pAVar13,(SequenceHeader *)(ulong)cm->seq_params->bit_depth,
                      use_filter_type);
          uVar11 = tx_size_high_unit[*pbVar20];
          iVar23 = iVar23 + uVar11;
          dst = dst + iVar8 * 4 * uVar11;
          pbVar20 = pbVar20 + uVar11;
          pAVar13 = pAVar13 + uVar11;
        } while (iVar23 < iVar17);
      }
      uVar11 = uVar18 + 1;
    } while ((int)uVar11 < iVar14);
  }
  return;
}

Assistant:

void av1_filter_block_plane_horz_opt(
    const AV1_COMMON *const cm, const MACROBLOCKD *const xd,
    const MACROBLOCKD_PLANE *const plane_ptr, const uint32_t mi_row,
    const uint32_t mi_col, AV1_DEBLOCKING_PARAMETERS *params_buf,
    TX_SIZE *tx_buf, int num_mis_in_lpf_unit_height_log2) {
  uint8_t *const dst_ptr = plane_ptr->dst.buf;
  const int dst_stride = plane_ptr->dst.stride;
  // Ensure that mi_cols/mi_rows are calculated based on frame dimension aligned
  // to MI_SIZE.
  const int plane_mi_cols =
      CEIL_POWER_OF_TWO(plane_ptr->dst.width, MI_SIZE_LOG2);
  const int plane_mi_rows =
      CEIL_POWER_OF_TWO(plane_ptr->dst.height, MI_SIZE_LOG2);
  const int y_range = AOMMIN((int)(plane_mi_rows - mi_row),
                             (1 << num_mis_in_lpf_unit_height_log2));
  const int x_range = AOMMIN((int)(plane_mi_cols - mi_col), MAX_MIB_SIZE);

  const ptrdiff_t mode_step = cm->mi_params.mi_stride;
  for (int x = 0; x < x_range; x++) {
    const uint32_t curr_x = mi_col + x;
    const uint32_t y_start = mi_row;
    const uint32_t y_end = mi_row + y_range;
    int min_block_width = block_size_high[BLOCK_128X128];
    set_lpf_parameters_for_line_luma(params_buf, tx_buf, cm, xd, HORZ_EDGE,
                                     curr_x, y_start, plane_ptr, y_end,
                                     mode_step, &min_block_width);

    AV1_DEBLOCKING_PARAMETERS *params = params_buf;
    TX_SIZE *tx_size = tx_buf;
    USE_FILTER_TYPE filter_type = USE_SINGLE;

    uint8_t *p = dst_ptr + x * MI_SIZE;

    if ((x & 3) == 0 && (x + 3) < x_range && min_block_width >= 16) {
      // If we are on a col which is a multiple of 4, and the minimum width is
      // 16 pixels, then the current and right 3 cols must contain the same
      // prediction block. This is because dim 16 can only happen every unit of
      // 4 mi's.
      filter_type = USE_QUAD;
      x += 3;
    } else if ((x + 1) < x_range && min_block_width >= 8) {
      filter_type = USE_DUAL;
      x += 1;
    }

    for (int y = 0; y < y_range;) {
      if (*tx_size == TX_INVALID) {
        params->filter_length = 0;
        *tx_size = TX_4X4;
      }

      filter_horz(p, dst_stride, params, cm->seq_params, filter_type);

      // advance the destination pointer
      const uint32_t advance_units = tx_size_high_unit[*tx_size];
      y += advance_units;
      p += advance_units * dst_stride * MI_SIZE;
      params += advance_units;
      tx_size += advance_units;
    }
  }
}